

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O1

err_t bakeBSTSRunB(octet *key,bign_params *params,bake_settings *settings,octet *privkeyb,
                  bake_cert *certb,bake_certval_i vala,read_i read,write_i write,void *file)

{
  bool bVar1;
  bool_t bVar2;
  err_t eVar3;
  err_t eVar4;
  ulong uVar5;
  size_t sVar6;
  octet *in;
  blob_t blob;
  ulong uVar7;
  octet *out;
  ulong uVar8;
  octet *poVar9;
  size_t len;
  size_t local_58;
  octet *local_50;
  bign_params *local_48;
  bake_certval_i local_40;
  octet *local_38;
  
  local_40 = vala;
  bVar2 = memIsValid(key,0x20);
  if (bVar2 == 0) {
    return 0x6d;
  }
  local_38 = key;
  bVar2 = memIsValid(certb,0x18);
  if (bVar2 == 0) {
    return 0x6d;
  }
  uVar8 = params->l;
  if (((uVar8 != 0x80) && (uVar8 != 0x100)) && (uVar8 != 0xc0)) {
    return 0x1f6;
  }
  uVar5 = (uVar8 >> 2) + certb->len + 8;
  uVar7 = uVar8 >> 1;
  if (uVar8 >> 1 <= uVar5) {
    uVar7 = uVar5;
  }
  sVar6 = bignStart_keep(uVar8,bakeBSTS_deep);
  in = (octet *)blobCreate((uVar8 + 0x1f & 0x7fffffffffffffe0) + sVar6 + uVar7 + 0x440);
  if (in == (octet *)0x0) {
    return 0x6e;
  }
  uVar8 = params->l >> 1;
  uVar7 = certb->len + (params->l >> 2) + 8;
  if (uVar8 <= uVar7) {
    uVar8 = uVar7;
  }
  poVar9 = in + uVar8 + 0x200;
  eVar3 = bakeBSTSStart(poVar9,params,settings,privkeyb,certb);
  if (eVar3 != 0) goto LAB_00118a10;
  out = in + 0x200;
  local_48 = params;
  eVar3 = bakeBSTSStep2(out,poVar9);
  if ((eVar3 != 0) || (eVar3 = (*write)(&local_58,out,local_48->l >> 1,file), eVar3 != 0))
  goto LAB_00118a10;
  eVar3 = (*read)(&local_58,in,0x200,file);
  if (eVar3 == 0xffffffff) {
    eVar3 = bakeBSTSStep4(out,in,local_58,local_40,poVar9);
    if ((eVar3 != 0) ||
       (eVar3 = (*write)(&local_58,out,certb->len + (local_48->l >> 2) + 8,file), eVar3 != 0))
    goto LAB_00118a10;
  }
  else {
    if (eVar3 != 0) goto LAB_00118a10;
    blob = (blob_t)0x0;
    eVar3 = 0;
    local_50 = poVar9;
    while (eVar3 == 0) {
      sVar6 = blobSize(blob);
      blob = blobResize(blob,sVar6 + local_58);
      if (blob == (blob_t)0x0) goto LAB_00118bb6;
      sVar6 = blobSize(blob);
      memCopy((void *)((long)blob + (sVar6 - local_58)),in,local_58);
      eVar3 = (*read)(&local_58,in,0x200,file);
    }
    if (eVar3 == 0xffffffff) {
      sVar6 = blobSize(blob);
      poVar9 = (octet *)blobResize(blob,sVar6 + local_58);
      if (poVar9 == (octet *)0x0) {
LAB_00118bb6:
        eVar3 = 0x6e;
        goto LAB_00118bc6;
      }
      sVar6 = blobSize(poVar9);
      memCopy(poVar9 + (sVar6 - local_58),in,local_58);
      sVar6 = blobSize(poVar9);
      eVar4 = bakeBSTSStep4(out,poVar9,sVar6,local_40,local_50);
      blobClose(poVar9);
      eVar3 = eVar4;
      if ((eVar4 != 0) ||
         (eVar3 = (*write)(&local_58,out,certb->len + (local_48->l >> 2) + 8,file), eVar3 != 0))
      goto LAB_00118bc6;
      bVar1 = true;
      poVar9 = local_50;
    }
    else {
      blobClose(blob);
LAB_00118bc6:
      eVar4 = eVar3;
      poVar9 = local_50;
      blobClose(in);
      bVar1 = false;
    }
    if (!bVar1) {
      return eVar4;
    }
  }
  eVar3 = bakeBSTSStepG(local_38,poVar9);
LAB_00118a10:
  blobClose(in);
  return eVar3;
}

Assistant:

err_t bakeBSTSRunB(octet key[32], const bign_params* params,
	const bake_settings* settings, const octet privkeyb[],
	const bake_cert* certb, bake_certval_i vala,
	read_i read, write_i write, void* file)
{
	err_t code;
	size_t len;
	// блоб
	blob_t blob;
	octet* in;			/* [512] */
	octet* out;			/* [MAX2(l / 2, l / 4 + certb->len + 8)] */
	void* state;		/* [bakeBSTS_keep()] */
	// проверить входные данные
	if (!memIsValid(key, 32) ||
		!memIsValid(certb, sizeof(bake_cert)))
		return ERR_BAD_INPUT;
	// создать блоб
	if (params->l != 128 && params->l != 192 && params->l != 256)
		return ERR_BAD_PARAMS;
	blob = blobCreate(512 +
		MAX2(params->l / 2, params->l / 4 + certb->len + 8) +
		bakeBSTS_keep(params->l));
	if (blob == 0)
		return ERR_OUTOFMEMORY;
	// раскладка блоба
	in = (octet*)blob;
	out = in + 512;
	state = out + MAX2(params->l / 2, params->l / 4 + certb->len + 8);
	// старт
	code = bakeBSTSStart(state, params, settings, privkeyb, certb);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 2
	code = bakeBSTSStep2(out, state);
	ERR_CALL_HANDLE(code, blobClose(blob));
	code = write(&len, out, params->l / 2, file);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 4: прочитать блок M2
	code = read(&len, in, 512, file);
	// шаг 4: M2 из одного блока?
	if (code == ERR_MAX)
	{
		code = bakeBSTSStep4(out, in, len, vala, state);
		ERR_CALL_HANDLE(code, blobClose(blob));
		code = write(&len, out, params->l / 4 + certb->len + 8, file);
		ERR_CALL_HANDLE(code, blobClose(blob));
	}
	// шаг 4: ошибка при чтении
	else if (code != ERR_OK)
	{
		blobClose(blob);
		return code;
	}
	// шаг 4: обработать M2 из нескольких блоков
	else
	{
		blob_t M2 = 0;
		while (code == ERR_OK)
		{
			if ((M2 = blobResize(M2, blobSize(M2) + len)) == 0)
			{
				blobClose(blob);
				return ERR_OUTOFMEMORY;
			}
			memCopy((octet*)M2 + blobSize(M2) - len, in, len);
			code = read(&len, in, 512, file);
		}
		if (code != ERR_MAX)
		{
			blobClose(M2);
			blobClose(blob);
			return code;
		}
		if ((M2 = blobResize(M2, blobSize(M2) + len)) == 0)
		{
			blobClose(blob);
			return ERR_OUTOFMEMORY;
		}
		memCopy((octet*)M2 + blobSize(M2) - len, in, len);
		code = bakeBSTSStep4(out, M2, blobSize(M2), vala, state);
		blobClose(M2);
		ERR_CALL_HANDLE(code, blobClose(blob));
		code = write(&len, out, params->l / 4 + certb->len + 8, file);
		ERR_CALL_HANDLE(code, blobClose(blob));
	}
	// завершение
	code = bakeBSTSStepG(key, state);
	blobClose(blob);
	return code;
}